

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::gatherv_big<std::tuple<int,int,int>>
               (tuple<int,_int,_int> *data,size_t size,tuple<int,_int,_int> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  undefined4 uVar1;
  int iVar2;
  const_reference pvVar3;
  MPI_Datatype poVar4;
  MPI_Comm poVar5;
  MPI_Request *ppoVar6;
  void *__stat_loc;
  datatype local_e0;
  undefined1 local_c8 [8];
  datatype dt_1;
  datatype local_a0;
  undefined1 local_88 [8];
  datatype dt;
  long lStack_68;
  int i;
  size_t offset;
  undefined1 local_58 [4];
  int tag;
  requests reqs;
  comm *comm_local;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  tuple<int,_int,_int> *out_local;
  size_t size_local;
  tuple<int,_int,_int> *data_local;
  
  __stat_loc = (void *)size;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  requests::requests((requests *)local_58);
  iVar2 = mxx::comm::rank((comm *)reqs.m_requests.
                                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == root) {
    lStack_68 = 0;
    for (dt._20_4_ = 0; uVar1 = dt._20_4_,
        iVar2 = mxx::comm::size((comm *)reqs.m_requests.
                                        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (int)uVar1 < iVar2; dt._20_4_ = dt._20_4_ + 1) {
      get_datatype<std::tuple<int,int,int>>();
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (recv_sizes,(long)(int)dt._20_4_);
      mxx::datatype::contiguous((datatype *)local_88,&local_a0,*pvVar3);
      mxx::datatype::~datatype(&local_a0);
      if (dt._20_4_ == root) {
        std::copy<std::tuple<int,int,int>const*,std::tuple<int,int,int>*>
                  (data,data + size,out + lStack_68);
      }
      else {
        poVar4 = mxx::datatype::type((datatype *)local_88);
        uVar1 = dt._20_4_;
        poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_
                           ((comm *)reqs.m_requests.
                                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppoVar6 = requests::add((requests *)local_58);
        MPI_Irecv(out + lStack_68,1,poVar4,uVar1,0x4d2,poVar5,ppoVar6);
      }
      __stat_loc = (void *)(long)(int)dt._20_4_;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (recv_sizes,(size_type_conflict)__stat_loc);
      lStack_68 = *pvVar3 + lStack_68;
      mxx::datatype::~datatype((datatype *)local_88);
    }
  }
  else {
    get_datatype<std::tuple<int,int,int>>();
    mxx::datatype::contiguous((datatype *)local_c8,&local_e0,size);
    mxx::datatype::~datatype(&local_e0);
    poVar4 = mxx::datatype::type((datatype *)local_c8);
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_
                       ((comm *)reqs.m_requests.
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppoVar6 = requests::add((requests *)local_58);
    __stat_loc = (void *)0x1;
    MPI_Isend(data,1,poVar4,root,0x4d2,poVar5,ppoVar6);
    mxx::datatype::~datatype((datatype *)local_c8);
  }
  requests::wait((requests *)local_58,__stat_loc);
  requests::~requests((requests *)local_58);
  return;
}

Assistant:

void gatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(data, data+size, out+offset);
            } else {
                MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += recv_sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}